

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  ushort uVar1;
  undefined2 uVar2;
  int iVar3;
  float fVar4;
  undefined8 uVar5;
  stbi_uc sVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  stbi__context *data;
  float *__ptr;
  void *pvVar10;
  long lVar11;
  int *piVar12;
  stbi_uc *psVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  float *pfVar22;
  long in_FS_OFFSET;
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  stbi__gif local_88a0;
  
  psVar13 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  lVar14 = 0;
  ri_00 = ri;
  do {
    sVar6 = stbi__get8(s);
    if (sVar6 != (&stbi__check_png_header_png_sig)[lVar14]) {
      *(char **)(in_FS_OFFSET + -0x10) = "bad png sig";
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar7 = stbi__gif_test(s);
      if (iVar7 != 0) {
        memset(&local_88a0,0,0x8870);
        data = (stbi__context *)stbi__gif_load_next(s,&local_88a0,comp,0,psVar13);
        if (data == (stbi__context *)0x0 || data == s) {
          if (local_88a0.out != (stbi_uc *)0x0) {
            free(local_88a0.out);
          }
          data = (stbi__context *)0x0;
        }
        else {
          *x = local_88a0.w;
          *y = local_88a0.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            data = (stbi__context *)
                   stbi__convert_format((uchar *)data,4,req_comp,local_88a0.w,local_88a0.h);
          }
        }
        free(local_88a0.history);
        local_88a0.out = local_88a0.background;
        goto LAB_00142a5c;
      }
      iVar7 = stbi__hdr_test(s);
      if (iVar7 == 0) {
        pcVar9 = "unknown image type";
        goto LAB_001425ef;
      }
      piVar12 = comp;
      __ptr = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
      if (req_comp == 0) {
        req_comp = *comp;
      }
      if (__ptr == (float *)0x0) goto LAB_001425f8;
      iVar7 = *x;
      iVar3 = *y;
      pvVar10 = stbi__malloc_mad3(iVar7,iVar3,req_comp,(int)piVar12);
      if (pvVar10 != (void *)0x0) {
        uVar21 = iVar3 * iVar7;
        if (0 < (int)uVar21) {
          uVar18 = (req_comp + (req_comp & 1U)) - 1;
          lVar14 = (long)req_comp;
          uVar16 = 0;
          pvVar15 = pvVar10;
          pfVar22 = __ptr;
          do {
            uVar8 = 0;
            if (0 < (int)uVar18) {
              uVar19 = 0;
              do {
                dVar24 = pow((double)(pfVar22[uVar19] * stbi__h2l_scale_i),(double)stbi__h2l_gamma_i
                            );
                fVar23 = (float)dVar24 * 255.0 + 0.5;
                fVar4 = 0.0;
                if (0.0 <= fVar23) {
                  fVar4 = fVar23;
                }
                fVar23 = 255.0;
                if (fVar4 <= 255.0) {
                  fVar23 = fVar4;
                }
                *(char *)((long)pvVar15 + uVar19) = (char)(int)fVar23;
                uVar19 = uVar19 + 1;
                uVar8 = uVar18;
              } while (uVar18 != uVar19);
            }
            if ((int)uVar8 < req_comp) {
              lVar11 = (ulong)uVar8 + uVar16 * lVar14;
              fVar23 = __ptr[lVar11] * 255.0 + 0.5;
              fVar4 = 0.0;
              if (0.0 <= fVar23) {
                fVar4 = fVar23;
              }
              fVar23 = 255.0;
              if (fVar4 <= 255.0) {
                fVar23 = fVar4;
              }
              *(char *)((long)pvVar10 + lVar11) = (char)(int)fVar23;
            }
            uVar16 = uVar16 + 1;
            pvVar15 = (void *)((long)pvVar15 + lVar14);
            pfVar22 = pfVar22 + lVar14;
          } while (uVar16 != uVar21);
        }
        free(__ptr);
        return pvVar10;
      }
      free(__ptr);
      pcVar9 = "outofmem";
      goto LAB_001425ef;
    }
    lVar14 = lVar14 + 1;
  } while (lVar14 != 8);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  if ((uint)req_comp < 5) {
    local_88a0._0_8_ = s;
    iVar7 = stbi__parse_png_file((stbi__png *)&local_88a0,0,req_comp);
    uVar5 = local_88a0._0_8_;
    if (iVar7 == 0) {
      data = (stbi__context *)0x0;
    }
    else {
      iVar7 = 8;
      if ((8 < local_88a0.flags) && (iVar7 = 0x10, local_88a0.flags != 0x10)) {
        pcVar9 = "bad bits_per_channel";
        goto LAB_001425ef;
      }
      ri->bits_per_channel = iVar7;
      data = (stbi__context *)local_88a0.history;
      if ((req_comp != 0) && (iVar7 = *(int *)(local_88a0._0_8_ + 0xc), iVar7 != req_comp)) {
        uVar21 = *(stbi__uint32 *)local_88a0._0_8_;
        uVar18 = *(stbi__uint32 *)(local_88a0._0_8_ + 4);
        if (local_88a0.flags < 9) {
          data = (stbi__context *)
                 stbi__convert_format(local_88a0.history,iVar7,req_comp,uVar21,uVar18);
        }
        else {
          data = (stbi__context *)malloc((ulong)(req_comp * uVar21 * uVar18 * 2));
          if (data == (stbi__context *)0x0) {
            free(local_88a0.history);
            *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
            *(int *)(uVar5 + 0xc) = req_comp;
            goto LAB_001425f8;
          }
          if (0 < (int)uVar18) {
            uVar8 = req_comp + iVar7 * 8;
            if ((0x23 < uVar8) || ((0xe161a1c00U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/reidevries[P]batchglprocess/raylib-3.7.0/src/external/stb_image.h"
                            ,0x6fa,
                            "stbi__uint16 *stbi__convert_format16(stbi__uint16 *, int, int, unsigned int, unsigned int)"
                           );
            }
            iVar3 = uVar21 - 1;
            uVar19 = 0;
            uVar17 = 0;
            uVar16 = 0;
            do {
              iVar20 = uVar21 * (int)uVar16;
              if (uVar8 - 10 < 0x19) {
                psVar13 = (stbi_uc *)((long)local_88a0.history + 0x38) +
                          (ulong)(uint)(iVar20 * iVar7) * 2 + -0x38;
                switch(uVar8) {
                case 10:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      *(undefined2 *)(data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x38) =
                           *(undefined2 *)
                            ((stbi_uc *)((long)local_88a0.history + 0x38) +
                            lVar14 * 2 + uVar19 * 2 + -0x38);
                      (data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x36)[0] = 0xff;
                      (data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x36)[1] = 0xff;
                      lVar14 = lVar14 + 1;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0xb:
                  if (-1 < iVar3) {
                    psVar13 = data->buffer_start + uVar17 * 2 + -0x34;
                    lVar14 = 0;
                    do {
                      uVar2 = *(undefined2 *)
                               ((stbi_uc *)((long)local_88a0.history + 0x38) +
                               lVar14 * 2 + uVar19 * 2 + -0x38);
                      *(undefined2 *)psVar13 = uVar2;
                      *(undefined2 *)(psVar13 + -2) = uVar2;
                      *(undefined2 *)(psVar13 + -4) = uVar2;
                      lVar14 = lVar14 + 1;
                      psVar13 = psVar13 + 6;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0xc:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      auVar25._8_8_ = 0;
                      auVar25._0_8_ =
                           (ulong)*(ushort *)
                                   ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                   lVar14 * 2 + uVar19 * 2 + -0x38) | 0xffff0000;
                      auVar25 = pshuflw(auVar25,auVar25,0x40);
                      *(long *)(data->buffer_start + lVar14 * 8 + uVar17 * 2 + -0x38) =
                           auVar25._0_8_;
                      lVar14 = lVar14 + 1;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                default:
                  goto switchD_001426e4_caseD_d;
                case 0x11:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      *(undefined2 *)(data->buffer_start + lVar14 * 2 + uVar17 * 2 + -0x38) =
                           *(undefined2 *)
                            ((stbi_uc *)((long)local_88a0.history + 0x38) +
                            lVar14 * 4 + uVar19 * 2 + -0x38);
                      lVar14 = lVar14 + 1;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0x13:
                  if (-1 < iVar3) {
                    psVar13 = data->buffer_start + uVar17 * 2 + -0x34;
                    lVar14 = 0;
                    do {
                      uVar2 = *(undefined2 *)
                               ((stbi_uc *)((long)local_88a0.history + 0x38) +
                               lVar14 * 4 + uVar19 * 2 + -0x38);
                      *(undefined2 *)psVar13 = uVar2;
                      *(undefined2 *)(psVar13 + -2) = uVar2;
                      *(undefined2 *)(psVar13 + -4) = uVar2;
                      lVar14 = lVar14 + 1;
                      psVar13 = psVar13 + 6;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0x14:
                  if (-1 < iVar3) {
                    lVar14 = uVar17 * 2;
                    lVar11 = 0;
                    do {
                      uVar2 = *(undefined2 *)
                               ((stbi_uc *)((long)local_88a0.history + 0x38) +
                               lVar11 * 4 + uVar19 * 2 + -0x38);
                      *(undefined2 *)(data->buffer_start + lVar11 * 8 + lVar14 + -0x34) = uVar2;
                      *(undefined2 *)(data->buffer_start + lVar11 * 8 + lVar14 + -0x36) = uVar2;
                      *(undefined2 *)(data->buffer_start + lVar11 * 8 + lVar14 + -0x38) = uVar2;
                      *(undefined2 *)(data->buffer_start + lVar11 * 8 + lVar14 + -0x32) =
                           *(undefined2 *)
                            ((stbi_uc *)((long)local_88a0.history + 0x38) +
                            lVar11 * 4 + uVar19 * 2 + -0x36);
                      lVar11 = lVar11 + 1;
                    } while (uVar21 != (uint)lVar11);
                  }
                  break;
                case 0x19:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      uVar1 = *(ushort *)(psVar13 + 4);
                      *(short *)(data->buffer_start + lVar14 * 2 + uVar17 * 2 + -0x38) =
                           (short)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                                   (uint)*(ushort *)(psVar13 + 2) * 0x96 +
                                   (uint)*(ushort *)psVar13 * 0x4d >> 8);
                      lVar14 = lVar14 + 1;
                      psVar13 = psVar13 + 6;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0x1a:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      uVar1 = *(ushort *)(psVar13 + 4);
                      *(short *)(data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x38) =
                           (short)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                                   (uint)*(ushort *)(psVar13 + 2) * 0x96 +
                                   (uint)*(ushort *)psVar13 * 0x4d >> 8);
                      (data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x36)[0] = 0xff;
                      (data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x36)[1] = 0xff;
                      lVar14 = lVar14 + 1;
                      psVar13 = psVar13 + 6;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0x1c:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      *(ushort *)(data->buffer_start + lVar14 * 8 + uVar17 * 2 + -0x38) =
                           *(ushort *)psVar13;
                      *(ushort *)(data->buffer_start + lVar14 * 8 + uVar17 * 2 + -0x36) =
                           *(ushort *)(psVar13 + 2);
                      *(ushort *)(data->buffer_start + lVar14 * 8 + uVar17 * 2 + -0x34) =
                           *(ushort *)(psVar13 + 4);
                      (data->buffer_start + lVar14 * 8 + uVar17 * 2 + -0x32)[0] = 0xff;
                      (data->buffer_start + lVar14 * 8 + uVar17 * 2 + -0x32)[1] = 0xff;
                      lVar14 = lVar14 + 1;
                      psVar13 = psVar13 + 6;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0x21:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      uVar1 = *(ushort *)
                               ((stbi_uc *)((long)local_88a0.history + 0x38) +
                               lVar14 * 8 + uVar19 * 2 + -0x34);
                      *(short *)(data->buffer_start + lVar14 * 2 + uVar17 * 2 + -0x38) =
                           (short)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                                   (uint)*(ushort *)
                                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                          lVar14 * 8 + uVar19 * 2 + -0x36) * 0x96 +
                                   (uint)*(ushort *)
                                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                          lVar14 * 8 + uVar19 * 2 + -0x38) * 0x4d >> 8);
                      lVar14 = lVar14 + 1;
                    } while (uVar21 != (uint)lVar14);
                  }
                  break;
                case 0x22:
                  if (-1 < iVar3) {
                    lVar14 = 0;
                    do {
                      uVar1 = *(ushort *)
                               ((stbi_uc *)((long)local_88a0.history + 0x38) +
                               lVar14 * 8 + uVar19 * 2 + -0x34);
                      *(short *)(data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x38) =
                           (short)((uint)uVar1 * 2 + ((uint)uVar1 + (uint)uVar1 * 8) * 3 +
                                   (uint)*(ushort *)
                                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                          lVar14 * 8 + uVar19 * 2 + -0x36) * 0x96 +
                                   (uint)*(ushort *)
                                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                                          lVar14 * 8 + uVar19 * 2 + -0x38) * 0x4d >> 8);
                      *(undefined2 *)(data->buffer_start + lVar14 * 4 + uVar17 * 2 + -0x36) =
                           *(undefined2 *)
                            ((stbi_uc *)((long)local_88a0.history + 0x38) +
                            lVar14 * 8 + uVar19 * 2 + -0x32);
                      lVar14 = lVar14 + 1;
                    } while (uVar21 != (uint)lVar14);
                  }
                }
              }
              else {
switchD_001426e4_caseD_d:
                if (-1 < iVar3) {
                  psVar13 = data->buffer_start + (ulong)(uint)(iVar20 * req_comp) * 2 + -0x38;
                  lVar14 = 0;
                  do {
                    *(undefined2 *)psVar13 =
                         *(undefined2 *)
                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                          lVar14 * 8 + uVar19 * 2 + -0x38);
                    *(undefined2 *)(psVar13 + 2) =
                         *(undefined2 *)
                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                          lVar14 * 8 + uVar19 * 2 + -0x36);
                    *(undefined2 *)(psVar13 + 4) =
                         *(undefined2 *)
                          ((stbi_uc *)((long)local_88a0.history + 0x38) +
                          lVar14 * 8 + uVar19 * 2 + -0x34);
                    lVar14 = lVar14 + 1;
                    psVar13 = psVar13 + 6;
                  } while (uVar21 != (uint)lVar14);
                }
              }
              uVar16 = uVar16 + 1;
              uVar17 = (ulong)((int)uVar17 + uVar21 * req_comp);
              uVar19 = (ulong)((int)uVar19 + iVar7 * uVar21);
            } while (uVar16 != uVar18);
          }
          free(local_88a0.history);
        }
        *(int *)(uVar5 + 0xc) = req_comp;
        if (data == (stbi__context *)0x0) goto LAB_001425f8;
      }
      *x = *(stbi__uint32 *)uVar5;
      *y = *(stbi__uint32 *)(uVar5 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar5 + 8);
      }
      local_88a0.history = (stbi_uc *)0x0;
    }
    free(local_88a0.history);
    free(local_88a0.background);
LAB_00142a5c:
    free(local_88a0.out);
  }
  else {
    pcVar9 = "bad req_comp";
LAB_001425ef:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar9;
LAB_001425f8:
    data = (stbi__context *)0x0;
  }
  return data;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}